

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O3

void __thiscall
JsonObject_SingleKvpBadEndObject_Test::~JsonObject_SingleKvpBadEndObject_Test
          (JsonObject_SingleKvpBadEndObject_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonObject).super_Test._vptr_Test = (_func_int **)&PTR__JsonObject_001bf8a8;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonObject).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonObject, SingleKvpBadEndObject) {
    std::error_code const end_object_error = make_error_code (std::errc::io_error);

    using ::testing::_;
    using ::testing::Return;
    EXPECT_CALL (callbacks_, begin_object ());
    EXPECT_CALL (callbacks_, key (_));
    EXPECT_CALL (callbacks_, uint64_value (_));
    EXPECT_CALL (callbacks_, end_object ()).WillOnce (Return (end_object_error));

    auto p = json::make_parser (proxy_);
    p.input (std::string{"{\n\"a\" : 1\n}"});
    p.eof ();
    EXPECT_TRUE (p.has_error ());
    EXPECT_EQ (p.last_error (), end_object_error)
        << "Expected the error to be propagated from the end_object() callback";
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 3U}));
}